

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O1

char * fy_token_get_direct_output(fy_token *fyt,size_t *sizep)

{
  fy_input *pfVar1;
  void *pvVar2;
  long lVar3;
  
  if (((fyt == (fy_token *)0x0) || (((fyt->handle).field_0x35 & 4) == 0)) ||
     ((fyt->type | FYTT_KEY) == FYTT_TAG)) {
    *sizep = 0;
    return (char *)0x0;
  }
  *sizep = (fyt->handle).end_mark.input_pos - (fyt->handle).start_mark.input_pos;
  pfVar1 = (fyt->handle).fyi;
  lVar3 = 0x48;
  switch((pfVar1->cfg).type) {
  case fyit_file:
    pvVar2 = (pfVar1->field_11).file.addr;
    if (pvVar2 != (void *)0x0) goto LAB_0013da15;
    break;
  case fyit_stream:
    break;
  case fyit_memory:
  case fyit_alloc:
    lVar3 = 0x28;
    break;
  default:
    pvVar2 = (void *)0x0;
    goto LAB_0013da15;
  }
  pvVar2 = *(void **)((long)&(pfVar1->node).next + lVar3);
LAB_0013da15:
  if (pvVar2 != (void *)0x0) {
    return (char *)((long)pvVar2 + (fyt->handle).start_mark.input_pos);
  }
  __assert_fail("ptr",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-input.h"
                ,0x9a,"const void *fy_input_start(const struct fy_input *)");
}

Assistant:

const char *fy_token_get_direct_output(struct fy_token *fyt, size_t *sizep) {
    const struct fy_atom *fya;

    fya = fy_token_atom(fyt);
    if (!fya || !fya->direct_output ||
        (fyt->type == FYTT_TAG || fyt->type == FYTT_TAG_DIRECTIVE)) {
        *sizep = 0;
        return NULL;
    }
    *sizep = fy_atom_size(fya);
    return fy_atom_data(fya);
}